

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linei_intersector.h
# Opt level: O2

bool embree::avx::FlatLinearCurveMiIntersectorK<8,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Scene *pSVar10;
  Geometry *pGVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  ulong uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  byte bVar19;
  uint uVar20;
  ulong uVar21;
  float fVar22;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  float fVar32;
  undefined1 auVar25 [32];
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar39;
  float fVar40;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  float fVar41;
  undefined1 auVar38 [32];
  float fVar45;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar46 [32];
  float fVar53;
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [64];
  float fVar71;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar72 [64];
  undefined1 auVar79 [16];
  undefined1 auVar81 [64];
  float fVar82;
  undefined1 auVar83 [64];
  float in_register_0000151c;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  RTCFilterFunctionNArguments args;
  LineIntersectorHitM<8> hit;
  undefined1 local_350 [16];
  size_t local_338;
  RTCFilterFunctionNArguments local_330;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  RTCHitN local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined1 local_270 [16];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  uint local_240;
  uint uStack_23c;
  uint uStack_238;
  uint uStack_234;
  uint uStack_230;
  uint uStack_22c;
  uint uStack_228;
  uint uStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [2] [32];
  undefined1 auVar66 [64];
  undefined1 auVar80 [32];
  
  pSVar10 = context->scene;
  uVar20 = line->sharedGeomID;
  uVar2 = (line->v0).field_0.i[0];
  pGVar11 = (pSVar10->geometries).items[uVar20].ptr;
  lVar12 = *(long *)&pGVar11[1].time_range.upper;
  p_Var13 = pGVar11[1].intersectionFilterN;
  uVar3 = (line->v0).field_0.i[1];
  uVar4 = (line->v0).field_0.i[4];
  auVar23._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar4 * (long)p_Var13);
  auVar23._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar2 * (long)p_Var13);
  uVar5 = (line->v0).field_0.i[2];
  uVar6 = (line->v0).field_0.i[3];
  uVar7 = (line->v0).field_0.i[5];
  auVar36._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar7 * (long)p_Var13);
  auVar36._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar3 * (long)p_Var13);
  uVar8 = (line->v0).field_0.i[6];
  auVar46._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar8 * (long)p_Var13);
  auVar46._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar5 * (long)p_Var13);
  uVar9 = (line->v0).field_0.i[7];
  auVar54._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar9 * (long)p_Var13);
  auVar54._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar6 * (long)p_Var13);
  auVar57._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar4 + 1) * (long)p_Var13);
  auVar57._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar2 + 1) * (long)p_Var13);
  auVar59._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar7 + 1) * (long)p_Var13);
  auVar59._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar3 + 1) * (long)p_Var13);
  auVar61._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar8 + 1) * (long)p_Var13);
  auVar61._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar5 + 1) * (long)p_Var13);
  auVar67._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar9 + 1) * (long)p_Var13);
  auVar67._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar6 + 1) * (long)p_Var13);
  auVar16 = vunpcklps_avx(auVar23,auVar46);
  auVar69 = vunpckhps_avx(auVar23,auVar46);
  auVar23 = vunpcklps_avx(auVar36,auVar54);
  auVar15 = vunpckhps_avx(auVar36,auVar54);
  local_200 = vunpcklps_avx(auVar16,auVar23);
  local_2e0 = vunpckhps_avx(auVar16,auVar23);
  local_1c0 = vunpcklps_avx(auVar69,auVar15);
  auVar25 = vunpckhps_avx(auVar69,auVar15);
  auVar15 = vunpcklps_avx(auVar57,auVar61);
  auVar69 = vunpckhps_avx(auVar57,auVar61);
  auVar16 = vunpcklps_avx(auVar59,auVar67);
  auVar23 = vunpckhps_avx(auVar59,auVar67);
  local_180 = vunpcklps_avx(auVar15,auVar16);
  local_1a0 = vunpckhps_avx(auVar15,auVar16);
  local_220 = vunpcklps_avx(auVar69,auVar23);
  local_160 = vunpckhps_avx(auVar69,auVar23);
  auVar34 = vpcmpeqd_avx(local_160._0_16_,local_160._0_16_);
  auVar35 = vpcmpeqd_avx(auVar34,*(undefined1 (*) [16])(line->primIDs).field_0.field_1.vl);
  auVar34 = vpcmpeqd_avx(auVar34,*(undefined1 (*) [16])((long)&(line->primIDs).field_0 + 0x10));
  local_140._16_16_ = auVar34;
  local_140._0_16_ = auVar35;
  local_1d0 = vshufps_avx(ZEXT416(uVar20),ZEXT416(uVar20),0);
  local_1e0 = local_1d0;
  fVar45 = pre->ray_space[k].vy.field_0.m128[0];
  fVar22 = pre->ray_space[k].vy.field_0.m128[1];
  fVar26 = pre->ray_space[k].vz.field_0.m128[0];
  fVar27 = pre->ray_space[k].vz.field_0.m128[1];
  fVar28 = *(float *)(ray + k * 4 + 0x10);
  auVar64._4_4_ = fVar28;
  auVar64._0_4_ = fVar28;
  auVar64._8_4_ = fVar28;
  auVar64._12_4_ = fVar28;
  auVar64._16_4_ = fVar28;
  auVar64._20_4_ = fVar28;
  auVar64._24_4_ = fVar28;
  auVar64._28_4_ = fVar28;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar37._4_4_ = uVar1;
  auVar37._0_4_ = uVar1;
  auVar37._8_4_ = uVar1;
  auVar37._12_4_ = uVar1;
  auVar37._16_4_ = uVar1;
  auVar37._20_4_ = uVar1;
  auVar37._24_4_ = uVar1;
  auVar37._28_4_ = uVar1;
  auVar69 = vsubps_avx(local_2e0,auVar64);
  auVar15 = vsubps_avx(local_1c0,auVar37);
  fVar51 = auVar15._0_4_;
  fVar52 = auVar15._4_4_;
  fVar33 = auVar15._8_4_;
  fVar40 = auVar15._12_4_;
  fVar47 = auVar15._16_4_;
  fVar49 = auVar15._20_4_;
  fVar53 = auVar15._24_4_;
  fVar43 = auVar69._0_4_;
  fVar44 = auVar69._4_4_;
  fVar39 = auVar69._8_4_;
  fVar41 = auVar69._12_4_;
  fVar48 = auVar69._16_4_;
  fVar50 = auVar69._20_4_;
  fVar82 = auVar69._24_4_;
  fVar29 = pre->ray_space[k].vy.field_0.m128[2];
  fVar30 = pre->ray_space[k].vz.field_0.m128[2];
  fVar31 = pre->ray_space[k].vx.field_0.m128[0];
  uVar1 = *(undefined4 *)(ray + k * 4);
  auVar62._4_4_ = uVar1;
  auVar62._0_4_ = uVar1;
  auVar62._8_4_ = uVar1;
  auVar62._12_4_ = uVar1;
  auVar62._16_4_ = uVar1;
  auVar62._20_4_ = uVar1;
  auVar62._24_4_ = uVar1;
  auVar62._28_4_ = uVar1;
  auVar16 = vsubps_avx(local_200,auVar62);
  fVar71 = auVar16._0_4_;
  fVar73 = auVar16._4_4_;
  fVar74 = auVar16._8_4_;
  fVar75 = auVar16._12_4_;
  fVar76 = auVar16._16_4_;
  fVar77 = auVar16._20_4_;
  fVar78 = auVar16._24_4_;
  auVar68._0_4_ = fVar71 * fVar31 + fVar45 * fVar43 + fVar26 * fVar51;
  auVar68._4_4_ = fVar73 * fVar31 + fVar45 * fVar44 + fVar26 * fVar52;
  auVar68._8_4_ = fVar74 * fVar31 + fVar45 * fVar39 + fVar26 * fVar33;
  auVar68._12_4_ = fVar75 * fVar31 + fVar45 * fVar41 + fVar26 * fVar40;
  auVar68._16_4_ = fVar76 * fVar31 + fVar45 * fVar48 + fVar26 * fVar47;
  auVar68._20_4_ = fVar77 * fVar31 + fVar45 * fVar50 + fVar26 * fVar49;
  auVar68._24_4_ = fVar78 * fVar31 + fVar45 * fVar82 + fVar26 * fVar53;
  auVar68._28_4_ = in_register_0000151c + auVar23._28_4_ + in_register_0000151c;
  fVar32 = pre->ray_space[k].vx.field_0.m128[1];
  auVar84._0_4_ = fVar71 * fVar32 + fVar27 * fVar51 + fVar22 * fVar43;
  auVar84._4_4_ = fVar73 * fVar32 + fVar27 * fVar52 + fVar22 * fVar44;
  auVar84._8_4_ = fVar74 * fVar32 + fVar27 * fVar33 + fVar22 * fVar39;
  auVar84._12_4_ = fVar75 * fVar32 + fVar27 * fVar40 + fVar22 * fVar41;
  auVar84._16_4_ = fVar76 * fVar32 + fVar27 * fVar47 + fVar22 * fVar48;
  auVar84._20_4_ = fVar77 * fVar32 + fVar27 * fVar49 + fVar22 * fVar50;
  auVar84._24_4_ = fVar78 * fVar32 + fVar27 * fVar53 + fVar22 * fVar82;
  auVar84._28_4_ = in_register_0000151c + in_register_0000151c + local_2e0._28_4_;
  fVar42 = pre->ray_space[k].vx.field_0.m128[2];
  auVar79._0_4_ = fVar71 * fVar42 + fVar43 * fVar29 + fVar51 * fVar30;
  auVar79._4_4_ = fVar73 * fVar42 + fVar44 * fVar29 + fVar52 * fVar30;
  auVar79._8_4_ = fVar74 * fVar42 + fVar39 * fVar29 + fVar33 * fVar30;
  auVar79._12_4_ = fVar75 * fVar42 + fVar41 * fVar29 + fVar40 * fVar30;
  auVar80._16_4_ = fVar76 * fVar42 + fVar48 * fVar29 + fVar47 * fVar30;
  auVar80._0_16_ = auVar79;
  auVar80._20_4_ = fVar77 * fVar42 + fVar50 * fVar29 + fVar49 * fVar30;
  auVar80._24_4_ = fVar78 * fVar42 + fVar82 * fVar29 + fVar53 * fVar30;
  auVar80._28_4_ = auVar16._28_4_ + auVar69._28_4_ + auVar15._28_4_;
  auVar69 = vsubps_avx(local_220,auVar37);
  fVar51 = auVar69._0_4_;
  fVar44 = auVar69._4_4_;
  fVar40 = auVar69._8_4_;
  fVar48 = auVar69._12_4_;
  fVar53 = auVar69._16_4_;
  fVar73 = auVar69._20_4_;
  fVar76 = auVar69._24_4_;
  auVar15 = vsubps_avx(local_1a0,auVar64);
  fVar43 = auVar15._0_4_;
  fVar33 = auVar15._4_4_;
  fVar41 = auVar15._8_4_;
  fVar49 = auVar15._12_4_;
  fVar82 = auVar15._16_4_;
  fVar74 = auVar15._20_4_;
  fVar77 = auVar15._24_4_;
  auVar16 = vsubps_avx(local_180,auVar62);
  fVar52 = auVar16._0_4_;
  fVar39 = auVar16._4_4_;
  fVar47 = auVar16._8_4_;
  fVar50 = auVar16._12_4_;
  fVar71 = auVar16._16_4_;
  fVar75 = auVar16._20_4_;
  fVar78 = auVar16._24_4_;
  auVar58._0_4_ = fVar31 * fVar52 + fVar26 * fVar51 + fVar45 * fVar43;
  auVar58._4_4_ = fVar31 * fVar39 + fVar26 * fVar44 + fVar45 * fVar33;
  auVar58._8_4_ = fVar31 * fVar47 + fVar26 * fVar40 + fVar45 * fVar41;
  auVar58._12_4_ = fVar31 * fVar50 + fVar26 * fVar48 + fVar45 * fVar49;
  auVar58._16_4_ = fVar31 * fVar71 + fVar26 * fVar53 + fVar45 * fVar82;
  auVar58._20_4_ = fVar31 * fVar75 + fVar26 * fVar73 + fVar45 * fVar74;
  auVar58._24_4_ = fVar31 * fVar78 + fVar26 * fVar76 + fVar45 * fVar77;
  auVar58._28_4_ = auVar15._28_4_ + local_220._28_4_ + fVar28;
  auVar60._0_4_ = fVar22 * fVar43 + fVar27 * fVar51 + fVar32 * fVar52;
  auVar60._4_4_ = fVar22 * fVar33 + fVar27 * fVar44 + fVar32 * fVar39;
  auVar60._8_4_ = fVar22 * fVar41 + fVar27 * fVar40 + fVar32 * fVar47;
  auVar60._12_4_ = fVar22 * fVar49 + fVar27 * fVar48 + fVar32 * fVar50;
  auVar60._16_4_ = fVar22 * fVar82 + fVar27 * fVar53 + fVar32 * fVar71;
  auVar60._20_4_ = fVar22 * fVar74 + fVar27 * fVar73 + fVar32 * fVar75;
  auVar60._24_4_ = fVar22 * fVar77 + fVar27 * fVar76 + fVar32 * fVar78;
  auVar60._28_4_ = local_220._28_4_ + fVar26 + fVar32;
  auVar24._0_4_ = fVar42 * fVar52 + fVar29 * fVar43 + fVar30 * fVar51;
  auVar24._4_4_ = fVar42 * fVar39 + fVar29 * fVar33 + fVar30 * fVar44;
  auVar24._8_4_ = fVar42 * fVar47 + fVar29 * fVar41 + fVar30 * fVar40;
  auVar24._12_4_ = fVar42 * fVar50 + fVar29 * fVar49 + fVar30 * fVar48;
  auVar24._16_4_ = fVar42 * fVar71 + fVar29 * fVar82 + fVar30 * fVar53;
  auVar24._20_4_ = fVar42 * fVar75 + fVar29 * fVar74 + fVar30 * fVar73;
  auVar24._24_4_ = fVar42 * fVar78 + fVar29 * fVar77 + fVar30 * fVar76;
  auVar24._28_4_ = fVar32 + fVar29 + auVar69._28_4_;
  auVar15 = vsubps_avx(auVar58,auVar68);
  auVar23 = vsubps_avx(auVar60,auVar84);
  fVar45 = auVar23._0_4_;
  fVar26 = auVar23._4_4_;
  fVar28 = auVar23._8_4_;
  fVar30 = auVar23._12_4_;
  fVar32 = auVar23._16_4_;
  fVar51 = auVar23._20_4_;
  fVar52 = auVar23._24_4_;
  fVar22 = auVar15._0_4_;
  fVar27 = auVar15._4_4_;
  fVar29 = auVar15._8_4_;
  fVar31 = auVar15._12_4_;
  fVar42 = auVar15._16_4_;
  fVar43 = auVar15._20_4_;
  fVar44 = auVar15._24_4_;
  auVar55._0_4_ = fVar22 * fVar22 + fVar45 * fVar45;
  auVar55._4_4_ = fVar27 * fVar27 + fVar26 * fVar26;
  auVar55._8_4_ = fVar29 * fVar29 + fVar28 * fVar28;
  auVar55._12_4_ = fVar31 * fVar31 + fVar30 * fVar30;
  auVar55._16_4_ = fVar42 * fVar42 + fVar32 * fVar32;
  auVar55._20_4_ = fVar43 * fVar43 + fVar51 * fVar51;
  auVar55._24_4_ = fVar44 * fVar44 + fVar52 * fVar52;
  auVar55._28_4_ = auVar58._28_4_ + auVar16._28_4_;
  auVar16._4_4_ = fVar26 * -auVar84._4_4_;
  auVar16._0_4_ = fVar45 * -auVar84._0_4_;
  auVar16._8_4_ = fVar28 * -auVar84._8_4_;
  auVar16._12_4_ = fVar30 * -auVar84._12_4_;
  auVar16._16_4_ = fVar32 * -auVar84._16_4_;
  auVar16._20_4_ = fVar51 * -auVar84._20_4_;
  auVar16._24_4_ = fVar52 * -auVar84._24_4_;
  auVar16._28_4_ = -auVar84._28_4_;
  auVar69 = vrcpps_avx(auVar55);
  auVar85._4_4_ = auVar68._4_4_ * fVar27;
  auVar85._0_4_ = auVar68._0_4_ * fVar22;
  auVar85._8_4_ = auVar68._8_4_ * fVar29;
  auVar85._12_4_ = auVar68._12_4_ * fVar31;
  auVar85._16_4_ = auVar68._16_4_ * fVar42;
  auVar85._20_4_ = auVar68._20_4_ * fVar43;
  auVar85._24_4_ = auVar68._24_4_ * fVar44;
  auVar85._28_4_ = uVar1;
  auVar16 = vsubps_avx(auVar16,auVar85);
  auVar63._8_4_ = 0x3f800000;
  auVar63._0_8_ = 0x3f8000003f800000;
  auVar63._12_4_ = 0x3f800000;
  auVar63._16_4_ = 0x3f800000;
  auVar63._20_4_ = 0x3f800000;
  auVar63._24_4_ = 0x3f800000;
  auVar63._28_4_ = 0x3f800000;
  fVar33 = auVar69._0_4_;
  fVar39 = auVar69._4_4_;
  auVar17._4_4_ = fVar39 * auVar55._4_4_;
  auVar17._0_4_ = fVar33 * auVar55._0_4_;
  fVar40 = auVar69._8_4_;
  auVar17._8_4_ = fVar40 * auVar55._8_4_;
  fVar41 = auVar69._12_4_;
  auVar17._12_4_ = fVar41 * auVar55._12_4_;
  fVar47 = auVar69._16_4_;
  auVar17._16_4_ = fVar47 * auVar55._16_4_;
  fVar48 = auVar69._20_4_;
  auVar17._20_4_ = fVar48 * auVar55._20_4_;
  fVar49 = auVar69._24_4_;
  auVar17._24_4_ = fVar49 * auVar55._24_4_;
  auVar17._28_4_ = auVar55._28_4_;
  auVar85 = vsubps_avx(auVar63,auVar17);
  auVar18._4_4_ = auVar16._4_4_ * (fVar39 + fVar39 * auVar85._4_4_);
  auVar18._0_4_ = auVar16._0_4_ * (fVar33 + fVar33 * auVar85._0_4_);
  auVar18._8_4_ = auVar16._8_4_ * (fVar40 + fVar40 * auVar85._8_4_);
  auVar18._12_4_ = auVar16._12_4_ * (fVar41 + fVar41 * auVar85._12_4_);
  auVar18._16_4_ = auVar16._16_4_ * (fVar47 + fVar47 * auVar85._16_4_);
  auVar18._20_4_ = auVar16._20_4_ * (fVar48 + fVar48 * auVar85._20_4_);
  auVar18._24_4_ = auVar16._24_4_ * (fVar49 + fVar49 * auVar85._24_4_);
  auVar18._28_4_ = auVar69._28_4_ + auVar85._28_4_;
  auVar69 = vminps_avx(auVar18,auVar63);
  auVar85 = ZEXT1232(ZEXT412(0)) << 0x20;
  local_120 = vmaxps_avx(auVar69,auVar85);
  fVar82 = local_120._0_4_;
  fVar71 = local_120._4_4_;
  fVar73 = local_120._8_4_;
  fVar74 = local_120._12_4_;
  fVar75 = local_120._16_4_;
  fVar76 = local_120._20_4_;
  fVar77 = local_120._24_4_;
  fVar33 = auVar68._0_4_ + fVar82 * fVar22;
  fVar39 = auVar68._4_4_ + fVar71 * fVar27;
  fVar40 = auVar68._8_4_ + fVar73 * fVar29;
  fVar41 = auVar68._12_4_ + fVar74 * fVar31;
  fVar42 = auVar68._16_4_ + fVar75 * fVar42;
  fVar43 = auVar68._20_4_ + fVar76 * fVar43;
  fVar44 = auVar68._24_4_ + fVar77 * fVar44;
  fVar45 = auVar84._0_4_ + fVar82 * fVar45;
  fVar47 = auVar84._4_4_ + fVar71 * fVar26;
  fVar48 = auVar84._8_4_ + fVar73 * fVar28;
  fVar49 = auVar84._12_4_ + fVar74 * fVar30;
  fVar50 = auVar84._16_4_ + fVar75 * fVar32;
  fVar51 = auVar84._20_4_ + fVar76 * fVar51;
  fVar52 = auVar84._24_4_ + fVar77 * fVar52;
  fVar53 = auVar84._28_4_ + auVar23._28_4_;
  auVar69 = vsubps_avx(auVar24,auVar80);
  auVar16 = vsubps_avx(local_160,auVar25);
  local_e0._0_4_ = auVar79._0_4_ + fVar82 * auVar69._0_4_;
  local_e0._4_4_ = auVar79._4_4_ + fVar71 * auVar69._4_4_;
  local_e0._8_4_ = auVar79._8_4_ + fVar73 * auVar69._8_4_;
  local_e0._12_4_ = auVar79._12_4_ + fVar74 * auVar69._12_4_;
  local_e0._16_4_ = auVar80._16_4_ + fVar75 * auVar69._16_4_;
  local_e0._20_4_ = auVar80._20_4_ + fVar76 * auVar69._20_4_;
  local_e0._24_4_ = auVar80._24_4_ + fVar77 * auVar69._24_4_;
  local_e0._28_4_ = auVar80._28_4_ + auVar69._28_4_;
  fVar22 = auVar25._0_4_ + fVar82 * auVar16._0_4_;
  fVar26 = auVar25._4_4_ + fVar71 * auVar16._4_4_;
  fVar27 = auVar25._8_4_ + fVar73 * auVar16._8_4_;
  fVar28 = auVar25._12_4_ + fVar74 * auVar16._12_4_;
  fVar29 = auVar25._16_4_ + fVar75 * auVar16._16_4_;
  fVar30 = auVar25._20_4_ + fVar76 * auVar16._20_4_;
  fVar31 = auVar25._24_4_ + fVar77 * auVar16._24_4_;
  fVar32 = auVar25._28_4_ + auVar69._28_4_;
  auVar38._0_4_ = fVar33 * fVar33 + fVar45 * fVar45;
  auVar38._4_4_ = fVar39 * fVar39 + fVar47 * fVar47;
  auVar38._8_4_ = fVar40 * fVar40 + fVar48 * fVar48;
  auVar38._12_4_ = fVar41 * fVar41 + fVar49 * fVar49;
  auVar38._16_4_ = fVar42 * fVar42 + fVar50 * fVar50;
  auVar38._20_4_ = fVar43 * fVar43 + fVar51 * fVar51;
  auVar38._24_4_ = fVar44 * fVar44 + fVar52 * fVar52;
  auVar38._28_4_ = auVar68._28_4_ + auVar15._28_4_ + fVar53;
  auVar69._4_4_ = fVar26 * fVar26;
  auVar69._0_4_ = fVar22 * fVar22;
  auVar69._8_4_ = fVar27 * fVar27;
  auVar69._12_4_ = fVar28 * fVar28;
  auVar69._16_4_ = fVar29 * fVar29;
  auVar69._20_4_ = fVar30 * fVar30;
  auVar69._24_4_ = fVar31 * fVar31;
  auVar69._28_4_ = fVar53;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar56._4_4_ = uVar1;
  auVar56._0_4_ = uVar1;
  auVar56._8_4_ = uVar1;
  auVar56._12_4_ = uVar1;
  auVar56._16_4_ = uVar1;
  auVar56._20_4_ = uVar1;
  auVar56._24_4_ = uVar1;
  auVar56._28_4_ = uVar1;
  auVar15 = vcmpps_avx(auVar38,auVar69,2);
  auVar69 = vcmpps_avx(auVar56,local_e0,2);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar65._4_4_ = uVar1;
  auVar65._0_4_ = uVar1;
  auVar65._8_4_ = uVar1;
  auVar65._12_4_ = uVar1;
  auVar65._16_4_ = uVar1;
  auVar65._20_4_ = uVar1;
  auVar65._24_4_ = uVar1;
  auVar65._28_4_ = uVar1;
  auVar66 = ZEXT3264(auVar65);
  auVar16 = vcmpps_avx(local_e0,auVar65,2);
  auVar69 = vandps_avx(auVar16,auVar69);
  fVar45 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
  auVar69 = vandps_avx(auVar69,auVar15);
  auVar15._4_4_ = fVar45 * (fVar26 + fVar26);
  auVar15._0_4_ = fVar45 * (fVar22 + fVar22);
  auVar15._8_4_ = fVar45 * (fVar27 + fVar27);
  auVar15._12_4_ = fVar45 * (fVar28 + fVar28);
  auVar15._16_4_ = fVar45 * (fVar29 + fVar29);
  auVar15._20_4_ = fVar45 * (fVar30 + fVar30);
  auVar15._24_4_ = fVar45 * (fVar31 + fVar31);
  auVar15._28_4_ = fVar32 + fVar32;
  auVar15 = vcmpps_avx(local_e0,auVar15,6);
  auVar69 = vandps_avx(auVar15,auVar69);
  auVar34 = vpslld_avx(auVar69._0_16_,0x1f);
  auVar35 = vpsrad_avx(auVar34,0x1f);
  auVar34 = vpslld_avx(auVar69._16_16_,0x1f);
  auVar34 = vpsrad_avx(auVar34,0x1f);
  auVar25._16_16_ = auVar34;
  auVar25._0_16_ = auVar35;
  auVar69 = auVar25 & ~local_140;
  if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar69 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar69 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar69 >> 0x7f,0) != '\0') ||
        (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar69 >> 0xbf,0) != '\0') ||
      (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar69[0x1f] < '\0') {
    auVar69 = vandnps_avx(local_140,auVar25);
    local_c0 = vsubps_avx(local_180,local_200);
    local_a0 = vsubps_avx(local_1a0,local_2e0);
    local_80[0] = vsubps_avx(local_220,local_1c0);
    auVar15 = vcmpps_avx(auVar85,local_c0,4);
    auVar23 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar16 = vcmpps_avx(auVar23,local_a0,4);
    auVar16 = vorps_avx(auVar15,auVar16);
    auVar15 = vcmpps_avx(auVar23,local_80[0],4);
    auVar15 = vorps_avx(auVar16,auVar15);
    auVar16 = auVar69 & auVar15;
    if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar16 >> 0x7f,0) != '\0') ||
          (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar16 >> 0xbf,0) != '\0') ||
        (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar16[0x1f] < '\0')
    {
      auVar69 = vandps_avx(auVar15,auVar69);
      local_100 = ZEXT832(0) << 0x20;
      uVar20 = vmovmskps_avx(auVar69);
      uVar21 = (ulong)uVar20;
      bVar19 = (byte)k;
      auVar69 = vcmpps_avx(local_e0,local_e0,0xf);
      auVar70 = ZEXT3264(auVar69);
      auVar72 = ZEXT464(0) << 0x20;
      auVar34 = vpcmpeqd_avx(auVar79,auVar79);
      auVar81 = ZEXT1664(auVar34);
      auVar83 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
      local_338 = k;
      do {
        local_330.hit = local_2b0;
        local_330.valid = (int *)local_350;
        uVar14 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
          }
        }
        uVar20 = *(uint *)(local_1e0 + uVar14 * 4);
        pGVar11 = (pSVar10->geometries).items[uVar20].ptr;
        if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
            return true;
          }
          local_280 = *(undefined4 *)(local_120 + uVar14 * 4);
          uVar1 = *(undefined4 *)(local_100 + uVar14 * 4);
          local_270._4_4_ = uVar1;
          local_270._0_4_ = uVar1;
          local_270._8_4_ = uVar1;
          local_270._12_4_ = uVar1;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_e0 + uVar14 * 4);
          local_330.context = context->user;
          local_250 = vpshufd_avx(ZEXT416(uVar20),0);
          uVar20 = (line->primIDs).field_0.i[uVar14];
          local_260._4_4_ = uVar20;
          local_260._0_4_ = uVar20;
          local_260._8_4_ = uVar20;
          local_260._12_4_ = uVar20;
          uVar1 = *(undefined4 *)(local_c0 + uVar14 * 4);
          local_2b0._4_4_ = uVar1;
          local_2b0._0_4_ = uVar1;
          local_2b0._8_4_ = uVar1;
          local_2b0._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_a0 + uVar14 * 4);
          local_2a0._4_4_ = uVar1;
          local_2a0._0_4_ = uVar1;
          local_2a0._8_4_ = uVar1;
          local_2a0._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_80[0] + uVar14 * 4);
          local_290._4_4_ = uVar1;
          local_290._0_4_ = uVar1;
          local_290._8_4_ = uVar1;
          local_290._12_4_ = uVar1;
          uStack_23c = (local_330.context)->instID[0];
          local_240 = uStack_23c;
          uStack_238 = uStack_23c;
          uStack_234 = uStack_23c;
          uStack_230 = (local_330.context)->instPrimID[0];
          uStack_22c = uStack_230;
          uStack_228 = uStack_230;
          uStack_224 = uStack_230;
          local_350 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << (bVar19 & 0x1f)) * 0x10)
          ;
          local_330.geometryUserPtr = pGVar11->userPtr;
          local_330.N = 4;
          local_300 = auVar66._0_32_;
          local_330.ray = (RTCRayN *)ray;
          uStack_27c = local_280;
          uStack_278 = local_280;
          uStack_274 = local_280;
          if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar69 = ZEXT1632(auVar70._0_16_);
            auVar34 = auVar81._0_16_;
            (*pGVar11->occlusionFilterN)(&local_330);
            auVar83 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
            auVar34 = vpcmpeqd_avx(auVar34,auVar34);
            auVar81 = ZEXT1664(auVar34);
            auVar72 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar69 = vcmpps_avx(auVar69,auVar69,0xf);
            auVar70 = ZEXT3264(auVar69);
            auVar66 = ZEXT3264(local_300);
            k = local_338;
          }
          auVar34 = auVar81._0_16_;
          if (local_350 == (undefined1  [16])0x0) {
            auVar35 = vpcmpeqd_avx(auVar72._0_16_,(undefined1  [16])0x0);
            auVar34 = auVar34 ^ auVar35;
          }
          else {
            p_Var13 = context->args->filter;
            if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
              auVar69 = ZEXT1632(auVar70._0_16_);
              (*p_Var13)(&local_330);
              auVar83 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
              auVar34 = vpcmpeqd_avx(auVar34,auVar34);
              auVar81 = ZEXT1664(auVar34);
              auVar72 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar69 = vcmpps_avx(auVar69,auVar69,0xf);
              auVar70 = ZEXT3264(auVar69);
              auVar66 = ZEXT3264(local_300);
            }
            auVar35 = vpcmpeqd_avx(auVar72._0_16_,local_350);
            auVar34 = auVar81._0_16_ ^ auVar35;
            auVar35 = vblendvps_avx(auVar83._0_16_,*(undefined1 (*) [16])(local_330.ray + 0x80),
                                    auVar35);
            *(undefined1 (*) [16])(local_330.ray + 0x80) = auVar35;
          }
          auVar35._8_8_ = 0x100000001;
          auVar35._0_8_ = 0x100000001;
          if ((auVar35 & auVar34) != (undefined1  [16])0x0) {
            return true;
          }
          *(int *)(ray + k * 4 + 0x80) = auVar66._0_4_;
        }
        uVar21 = uVar21 ^ 1L << (uVar14 & 0x3f);
      } while (uVar21 != 0);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; line.gather(v0,v1,geom);
        const vbool<M> valid = line.valid();
        return FlatLinearCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }